

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ModuleDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModuleDeclarationSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ModuleHeaderSyntax&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
          (BumpAllocator *this,SyntaxKind *args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,ModuleHeaderSyntax *args_2,
          SyntaxList<slang::syntax::MemberSyntax> *args_3,Token *args_4,
          NamedBlockClauseSyntax **args_5)

{
  ModuleDeclarationSyntax *pMVar1;
  SyntaxList<slang::syntax::MemberSyntax> *in_RCX;
  ModuleHeaderSyntax *in_RDX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RSI;
  undefined8 in_RDI;
  SyntaxKind kind;
  NamedBlockClauseSyntax *in_R8;
  ModuleDeclarationSyntax *unaff_retaddr;
  Token in_stack_00000010;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  kind = (SyntaxKind)((ulong)in_RDI >> 0x20);
  pMVar1 = (ModuleDeclarationSyntax *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  slang::syntax::ModuleDeclarationSyntax::ModuleDeclarationSyntax
            (unaff_retaddr,kind,in_RSI,in_RDX,in_RCX,in_stack_00000010,in_R8);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }